

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

atom * newAtom(char *rec,int file,int model,residue *resDataBuf)

{
  residue_t *prVar1;
  char cVar2;
  int iVar3;
  int useCOScale;
  atom *a;
  char *pcVar4;
  char *pcVar5;
  char *__needle;
  float fVar6;
  char msg [100];
  
  a = (atom *)malloc(0x80);
  if (a == (atom *)0x0) {
    warn("could not allocate space for new atom");
    return (atom *)0x0;
  }
  a->r = resDataBuf;
  a->mark = 0;
  a->flags = 0;
  a->props = 0;
  a->next = (atom_t *)0x0;
  a->nextInBin = (atom_t *)0x0;
  a->scratch = (atom_t *)0x0;
  parseResidueName(rec,resDataBuf->resname);
  pcVar5 = a->atomname;
  parseAtomName(rec,pcVar5);
  prVar1 = a->r;
  prVar1->a = a;
  prVar1->file = file;
  prVar1->model = model;
  parseChain(rec,prVar1->chain);
  iVar3 = parseResidueNumber(rec);
  prVar1 = a->r;
  prVar1->resid = iVar3;
  parseResidueHy36Num(rec,prVar1->Hy36resno);
  cVar2 = parseResidueInsertionCode(rec);
  prVar1 = a->r;
  prVar1->resInsCode = cVar2;
  prVar1->rescnt = 0;
  cVar2 = parseAltLocCode(rec);
  a->altConf = cVar2;
  a->binSerialNum = '?';
  __needle = a->r->resname;
  pcVar4 = strstr(":ASX:GLX:ASN:GLN:",__needle);
  if ((pcVar4 == (char *)0x0) || (a->atomname[1] != 'A')) {
    iVar3 = identifyAtom(pcVar5,__needle,Verbose ^ 1);
    a->elem = iVar3;
  }
  else {
    iVar3 = identifyAtom(" O  ",__needle,Verbose ^ 1);
    a->elem = iVar3;
    sprintf(msg,"atom %s will be treated as oxygen",pcVar5);
    warn(msg);
    iVar3 = a->elem;
  }
  a->bondedto = (char *)0x0;
  iVar3 = getAtno(iVar3);
  if (iVar3 == 1) {
    a->atomclass = -1;
    if (UseHParent != '\0') goto LAB_0012b09c;
    pcVar5 = setHydrogenParentName(a->r->resname,pcVar5);
  }
  else {
    a->atomclass = a->elem;
    if (UseStdBond != '\x01') goto LAB_0012b09c;
    pcVar5 = setMainchainBonding(a->r->resname,pcVar5);
  }
  a->bondedto = pcVar5;
LAB_0012b09c:
  iVar3 = isHet(rec);
  setProperties(a,iVar3,HB2aromFace ^ 1,(uint)PermitCHXHB);
  if (ByNABaseColor == '\x01') {
    iVar3 = naBaseCategory(a);
    a->atomclass = iVar3;
  }
  parseXYZ(rec,&a->loc);
  a->iz = 0;
  a->ix = 0;
  a->iy = 0;
  fVar6 = parseOccupancy(rec);
  a->occ = fVar6;
  fVar6 = parseTempFactor(rec);
  a->bval = fVar6;
  parseSegID(rec,a->r->segid);
  prVar1 = a->r;
  iVar3 = strncmp(prVar1->segid,"    ",4);
  if (((iVar3 != 0) && (prVar1->chain[0] == ' ')) && (prVar1->chain[1] == ' ')) {
    prVar1->chain[0] = prVar1->segid[0];
    a->r->chain[1] = a->r->segid[1];
    a->r->chain[2] = a->r->segid[2];
    a->r->chain[3] = a->r->segid[3];
    a->r->chain[4] = '\0';
  }
  iVar3 = a->elem;
  useCOScale = isCarbonylAtom(a);
  fVar6 = getRadius(iVar3,useCOScale);
  a->radius = fVar6;
  fVar6 = getCovRad(a->elem);
  a->covRad = fVar6;
  return a;
}

Assistant:

atom * newAtom(char *rec, int file, int model, residue * resDataBuf)
{/*newAtom()*/
   atom *a = NULL;
   char msg[100];

   a = (atom *)malloc(sizeof(atom));
   if (a) {
      a->r = resDataBuf;

      a->next     = NULL;
      a->nextInBin= NULL;
      a->scratch  = NULL;
      a->mark = 0;    /* used to mark bonds */
      a->flags = 0;
      a->props = 0;
      parseResidueName(rec, a->r->resname);
      parseAtomName(rec, a->atomname);
      a->r->a = a; /* residue points back to this atom (can change for res) */
      a->r->file = file;
      a->r->model = model;
      parseChain(rec, a->r->chain);
     /* a->r->chain = parseChain(rec);*/
      a->r->resid = parseResidueNumber(rec);
      parseResidueHy36Num(rec, a->r->Hy36resno);
      a->r->resInsCode = parseResidueInsertionCode(rec);
      a->r->rescnt = 0;
      a->altConf = parseAltLocCode(rec);
      a->binSerialNum = '?'; /* set when we bin */
      if (strstr(":ASX:GLX:ASN:GLN:", a->r->resname) /* special case treats undecided */
      && (a->atomname[1] == 'A')) {             /* as an oxygen */
	 a->elem = identifyAtom(" O  ", a->r->resname, Verbose); /*dcr041007 allow warning  add resname to call */
	 sprintf(msg, "atom %s will be treated as oxygen", a->atomname);
	 warn(msg);
      }
      else { /* normal case */
	 a->elem = identifyAtom(a->atomname, a->r->resname, Verbose);/*dcr041007 allow warning  add resname to call */
      }

      /*next section seems to be the only place where atom->bondedto is set.*/
      /*select.c/setHydrogenParentName() and select.c/setMainchainBonding()*/
      /* both merely call stdconntable.c/searchForStdBondingPartner() */
      /* which constructs a search string from (a->r->resname, a->atomname) */
      /* and calls stdconntable.c/SearchStdResConnTable()  */
      /* which returns the string found in the StdResTblBucket[] hash table.*/
      /*This hash table is a marvelous tour de force listing of names of*/
      /*residue/atoms and what atoms they can be bonded to */

      a->bondedto = NULL;
      if (isHatom(a->elem)) {
	 a->atomclass = -1; /* to be specified later */
	 if (UseHParent) {
	    a->bondedto = setHydrogenParentName(a->r->resname, a->atomname);
	 }
      }
      else {
	 a->atomclass = a->elem;
	 if (UseStdBond) {
	    a->bondedto = setMainchainBonding(a->r->resname, a->atomname);

            /*setMainchainBonding() does not seem to have a distance limit*/
	 }
      }

      setProperties(a, isHet(rec), HB2aromFace, PermitCHXHB); /*select.c*/
        /*This is where (e.g.) both HET_PROP and DNA_PROP are set for the atom*/
      if (ByNABaseColor) {  /* forces coloring by base rather than atom type */
	 a->atomclass = naBaseCategory(a);
      }

      parseXYZ(rec, &(a->loc));
      a->ix = a->iy = a->iz = 0;

   /* note: H DONOR_PROP assignment done later in updateHydrogenInfo() */

      a->occ  = parseOccupancy(rec);
      a->bval = parseTempFactor(rec);
      parseSegID(rec, a->r->segid);

      //use SEGID instead of chainID if it exists and chainID is blank
      if ( (strncmp(a->r->segid, "    ",4) != 0) &&
           (strncmp(a->r->chain, "  ",2)   == 0)){
        //parseSegID(rec, a->r->chain);
        a->r->chain[0] = a->r->segid[0];
        a->r->chain[1] = a->r->segid[1];
        a->r->chain[2] = a->r->segid[2];
        a->r->chain[3] = a->r->segid[3];
        a->r->chain[4] = '\0';
      }

      a->radius = getRadius(a->elem, isCarbonylAtom(a));
      a->covRad = getCovRad(a->elem);
   }
   else {
      warn("could not allocate space for new atom");
   }
   return a;
}